

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::finish_multiline_example(vw *all,cb_explore_adf *data,multi_ex *ec_seq)

{
  pointer ppeVar1;
  multi_ex *__range1;
  pointer ppeVar2;
  
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    output_example_seq(all,data,ec_seq);
    CB_ADF::global_print_newline(all);
  }
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppeVar2 != ppeVar1; ppeVar2 = ppeVar2 + 1) {
    v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&((*ppeVar2)->l).simple);
  }
  VW::clear_seq_and_finish_examples(all,ec_seq);
  return;
}

Assistant:

void finish_multiline_example(vw& all, cb_explore_adf& data, multi_ex& ec_seq)
{
  if (ec_seq.size() > 0)
  {
    output_example_seq(all, data, ec_seq);
    CB_ADF::global_print_newline(all);
  }

  for (auto x : ec_seq)
  {
    x->l.cb.costs.clear();
  }

  VW::clear_seq_and_finish_examples(all, ec_seq);
}